

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ColumnIndex(Table *pTab,char *zCol)

{
  byte bVar1;
  byte *pbVar2;
  u8 uVar3;
  byte bVar4;
  int iVar5;
  Column *pCVar6;
  long lVar7;
  
  if ((zCol == (char *)0x0) || (bVar4 = *zCol, bVar4 == 0)) {
    uVar3 = '\0';
  }
  else {
    pbVar2 = (byte *)(zCol + 1);
    uVar3 = '\0';
    do {
      uVar3 = uVar3 + ""[bVar4];
      bVar4 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar4 != 0);
  }
  if (pTab->nCol < 1) {
    return -1;
  }
  pCVar6 = pTab->aCol;
  iVar5 = 0;
LAB_0019227c:
  if (pCVar6->hName == uVar3) {
    lVar7 = 0;
    do {
      bVar4 = pCVar6->zCnName[lVar7];
      bVar1 = zCol[lVar7];
      if (bVar4 == bVar1) {
        if ((ulong)bVar4 == 0) goto LAB_001922ad;
      }
      else if (""[bVar4] != ""[bVar1]) goto LAB_001922ad;
      lVar7 = lVar7 + 1;
    } while( true );
  }
  goto LAB_001922b2;
LAB_001922ad:
  if (bVar4 == bVar1) {
    return iVar5;
  }
LAB_001922b2:
  pCVar6 = pCVar6 + 1;
  iVar5 = iVar5 + 1;
  if (iVar5 == pTab->nCol) {
    return -1;
  }
  goto LAB_0019227c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnIndex(Table *pTab, const char *zCol){
  int i;
  u8 h = sqlite3StrIHash(zCol);
  Column *pCol;
  for(pCol=pTab->aCol, i=0; i<pTab->nCol; pCol++, i++){
    if( pCol->hName==h && sqlite3StrICmp(pCol->zCnName, zCol)==0 ) return i;
  }
  return -1;
}